

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O3

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                *this,size_t dist,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2)

{
  uint *puVar1;
  size_type __new_size;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  datatype mxxindex_t;
  MPI_Request recv_reqs [2];
  datatype local_60;
  undefined1 local_48 [24];
  
  __new_size = this->local_size;
  if (__new_size !=
      (long)(this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                 );
  }
  uVar8 = (this->part).prefix;
  uVar14 = (ulong)uVar8;
  puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar3 - (long)puVar2 >> 2 != __new_size) {
    if (puVar3 != puVar2) {
      (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    local_60._vptr_datatype = (_func_int **)((ulong)local_60._vptr_datatype & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (param_2,__new_size,(value_type_conflict3 *)&local_60);
  }
  local_60._vptr_datatype = (_func_int **)&PTR__datatype_001aaf70;
  local_60.mpitype = (MPI_Datatype)&ompi_mpi_unsigned;
  local_60.builtin = true;
  uVar11 = uVar14 + dist;
  uVar10 = 0;
  if (uVar11 < this->n) {
    puVar1 = &(this->part).div1mod;
    if ((uint)uVar11 < *puVar1) {
      uVar5 = (this->part).div;
      uVar4 = (this->part).mod;
      iVar7 = (int)((uVar11 & 0xffffffff) / (ulong)(uVar5 + 1));
    }
    else {
      uVar5 = (this->part).div;
      uVar4 = (this->part).mod;
      iVar7 = ((uint)uVar11 - *puVar1) / uVar5 + uVar4;
    }
    uVar13 = iVar7 + 1;
    if (uVar13 < uVar4) {
      uVar4 = uVar13;
    }
    uVar11 = (uVar4 + uVar5 * uVar13) - uVar11;
    uVar10 = 0;
    if (iVar7 != (this->comm).m_rank) {
      if (0x7ffffffe < uVar11) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,uVar11 & 0xffffffff,&ompi_mpi_unsigned,iVar7,2,
                (this->comm).mpi_comm,local_48);
      uVar10 = 1;
    }
    uVar9 = this->local_size - uVar11;
    if ((uVar11 <= this->local_size && uVar9 != 0) && (iVar7 != this->p + -1)) {
      if (0x7ffffffe < uVar9) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar11,uVar9,&ompi_mpi_unsigned,uVar13,2,
                (this->comm).mpi_comm,local_48 + uVar10 * 8);
      uVar10 = (ulong)((int)uVar10 + 1);
    }
  }
  if (dist <= (this->local_size + uVar14) - 1) {
    sVar12 = dist - uVar14;
    if (dist < uVar14 || sVar12 == 0) {
      uVar4 = uVar8 - (uint)dist;
      uVar5 = (this->part).div1mod;
      if (uVar4 < uVar5) {
        uVar11 = (ulong)uVar4 / (ulong)((this->part).div + 1);
      }
      else {
        uVar11 = (ulong)((uVar4 - uVar5) / (this->part).div + (this->part).mod);
      }
    }
    else {
      uVar5 = (this->part).div1mod;
      uVar11 = 0xffffffff;
    }
    uVar8 = (int)this->local_size + uVar8 + ~(uint)dist;
    if (uVar8 < uVar5) {
      uVar4 = (this->part).div;
      uVar8 = uVar8 / (uVar4 + 1);
    }
    else {
      uVar4 = (this->part).div;
      uVar8 = (uVar8 - uVar5) / uVar4 + (this->part).mod;
    }
    uVar5 = (uint)uVar11;
    if (uVar5 == uVar8) {
      sVar12 = 0;
    }
    else if (-1 < (int)uVar5) {
      if (uVar5 == (this->comm).m_rank) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar5 = uVar5 + 1;
      uVar13 = (this->part).mod;
      if (uVar5 < uVar13) {
        uVar13 = uVar5;
      }
      sVar12 = (dist - uVar14) + (ulong)(uVar4 * uVar5 + uVar13);
      MPI_Send((this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,sVar12 & 0xffffffff,&ompi_mpi_unsigned,
               uVar11,2,(this->comm).mpi_comm);
    }
    if (uVar8 == (this->comm).m_rank) {
      if (sVar12 != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar14 = this->local_size;
      if (dist < uVar14) {
        puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          puVar2[lVar6] = puVar3[dist + lVar6];
          lVar6 = lVar6 + 1;
        } while (uVar14 - dist != lVar6);
      }
    }
    else {
      MPI_Send((this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar12,(int)this->local_size - (int)sVar12
               ,&ompi_mpi_unsigned,uVar8,2,(this->comm).mpi_comm);
    }
  }
  MPI_Waitall(uVar10,local_48,0);
  mxx::datatype::~datatype(&local_60);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}